

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsCommon.cpp
# Opt level: O0

string * helics::zeromq::getZMQVersion_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  tuple<int,_int,_int> vers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b9 [5];
  
  zmq::version();
  __lhs = local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (allocator<char> *)in_stack_fffffffffffffef0);
  std::get<0ul,int,int,int>((tuple<int,_int,_int> *)0x4e0702);
  CLI::std::__cxx11::to_string(in_stack_fffffffffffffefc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
  std::operator+(__lhs,(char)((ulong)in_RDI >> 0x38));
  std::get<1ul,int,int,int>((tuple<int,_int,_int> *)0x4e0755);
  CLI::std::__cxx11::to_string(in_stack_fffffffffffffefc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
  std::operator+(__lhs,(char)((ulong)in_RDI >> 0x38));
  std::get<2ul,int,int,int>((tuple<int,_int,_int> *)0x4e07a8);
  CLI::std::__cxx11::to_string(in_stack_fffffffffffffefc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  return (string *)in_RDI;
}

Assistant:

std::string getZMQVersion()
{
    auto vers = zmq::version();
    return std::string("ZMQ v") + std::to_string(std::get<0>(vers)) + '.' +
        std::to_string(std::get<1>(vers)) + '.' + std::to_string(std::get<2>(vers));
}